

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_joystick.cpp
# Opt level: O0

void I_GetAxes(float *axes)

{
  bool bVar1;
  int local_14;
  int i;
  float *axes_local;
  
  for (local_14 = 0; local_14 < 5; local_14 = local_14 + 1) {
    axes[local_14] = 0.0;
  }
  bVar1 = FBoolCVar::operator_cast_to_bool(&use_joystick);
  if (bVar1) {
    SDLInputJoystickManager::AddAxes(JoystickManager,axes);
  }
  return;
}

Assistant:

void I_GetAxes(float axes[NUM_JOYAXIS])
{
	for (int i = 0; i < NUM_JOYAXIS; ++i)
	{
		axes[i] = 0;
	}
	if (use_joystick)
	{
		JoystickManager->AddAxes(axes);
	}
}